

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct32_high28_stage6_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i *in_XMM0_Qb;
  __m256i *in_YMM0_H;
  __m256i cospi_m48_m16;
  __m256i cospi_p48_p16;
  __m256i cospi_m16_p48;
  __m256i cospi_p32_p32;
  __m256i cospi_m32_p32;
  int32_t in_stack_000000b4;
  undefined7 in_stack_000000b8;
  __m256i *in_stack_000000f0;
  undefined1 in_stack_000000f8 [32];
  undefined1 in_stack_00000118 [32];
  undefined4 uVar1;
  undefined8 in_stack_fffffffffffffef0;
  
  uVar1 = (undefined4)in_stack_fffffffffffffef0;
  pair_set_w16_epi16((int16_t)((ulong)in_stack_fffffffffffffef0 >> 0x10),
                     (int16_t)in_stack_fffffffffffffef0);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  _r_00[0]._7_1_ = cos_bit;
  _r_00[0]._0_7_ = in_stack_000000b8;
  _r_00[1] = _r[0];
  _r_00[2] = _r[1];
  _r_00[3] = _r[2];
  btf_16_w16_avx2((__m256i)in_stack_00000118,(__m256i)in_stack_000000f8,in_stack_000000f0,x,_r_00,
                  in_stack_000000b4);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  _r_01[0]._7_1_ = cos_bit;
  _r_01[0]._0_7_ = in_stack_000000b8;
  _r_01[1] = _r[0];
  _r_01[2] = _r[1];
  _r_01[3] = _r[2];
  btf_16_w16_avx2((__m256i)in_stack_00000118,(__m256i)in_stack_000000f8,in_stack_000000f0,x,_r_01,
                  in_stack_000000b4);
  _r_02[0]._7_1_ = cos_bit;
  _r_02[0]._0_7_ = in_stack_000000b8;
  _r_02[1] = _r[0];
  _r_02[2] = _r[1];
  _r_02[3] = _r[2];
  btf_16_w16_avx2((__m256i)in_stack_00000118,(__m256i)in_stack_000000f8,in_stack_000000f0,x,_r_02,
                  in_stack_000000b4);
  _r_03[0]._7_1_ = cos_bit;
  _r_03[0]._0_7_ = in_stack_000000b8;
  _r_03[1] = _r[0];
  _r_03[2] = _r[1];
  _r_03[3] = _r[2];
  btf_16_w16_avx2((__m256i)in_stack_00000118,(__m256i)in_stack_000000f8,in_stack_000000f0,x,_r_03,
                  in_stack_000000b4);
  _r_04[0]._7_1_ = cos_bit;
  _r_04[0]._0_7_ = in_stack_000000b8;
  _r_04[1] = _r[0];
  _r_04[2] = _r[1];
  _r_04[3] = _r[2];
  btf_16_w16_avx2((__m256i)in_stack_00000118,(__m256i)in_stack_000000f8,in_stack_000000f0,x,_r_04,
                  in_stack_000000b4);
  return;
}

Assistant:

static inline void idct32_high28_stage6_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[19], &x[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[20], &x[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[21], &x[26], _r, cos_bit);
}